

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O3

SmallString<32U> * __thiscall
llvm::MD5::MD5Result::digest(SmallString<32U> *__return_storage_ptr__,MD5Result *this)

{
  SmallVectorImpl<char> *pSVar1;
  int i;
  long lVar2;
  raw_svector_ostream Res;
  format_object_base local_78;
  uchar local_68;
  raw_ostream local_60;
  SmallString<32U> *local_38;
  
  (__return_storage_ptr__->super_SmallVector<char,_32U>).super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &(__return_storage_ptr__->super_SmallVector<char,_32U>).super_SmallVectorStorage<char,_32U>;
  pSVar1 = &(__return_storage_ptr__->super_SmallVector<char,_32U>).super_SmallVectorImpl<char>;
  (pSVar1->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  local_60.BufferMode = InternalBuffer;
  local_60.OutBufStart = (char *)0x0;
  local_60.OutBufEnd = (char *)0x0;
  local_60.OutBufCur = (char *)0x0;
  local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_001cd518;
  local_38 = __return_storage_ptr__;
  raw_ostream::SetUnbuffered(&local_60);
  lVar2 = 0;
  do {
    local_78.Fmt = "%.2x";
    local_78._vptr_format_object_base = (_func_int **)&PTR_home_001cd5a8;
    local_68 = (this->Bytes)._M_elems[lVar2];
    raw_ostream::operator<<(&local_60,&local_78);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  raw_ostream::~raw_ostream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

SmallString<32> MD5::MD5Result::digest() const {
  SmallString<32> Str;
  raw_svector_ostream Res(Str);
  for (int i = 0; i < 16; ++i)
    Res << format("%.2x", Bytes[i]);
  return Str;
}